

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall arangodb::velocypack::Parser::parseObject(Parser *this)

{
  ValueLength position;
  AttributeTranslator *this_00;
  Builder *pBVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  uint64_t v;
  Exception *this_01;
  string_view key_00;
  Slice key;
  uint8_t *local_40;
  uint8_t *local_38;
  
  Builder::addCompoundValue(this->_builderPtr,'\v');
  increaseNesting(this);
  iVar3 = 0x11622b;
  iVar2 = skipWhiteSpace(this,"Expecting item or \'}\'");
  if (iVar2 == 0x7d) {
    if (this->_pos < this->_size) {
      this->_pos = this->_pos + 1;
    }
    if ((this->_nesting != 0) || (this->options->keepTopLevelOpen == false)) {
      this->_nesting = this->_nesting - 1;
      Builder::close(this->_builderPtr,iVar3);
      return;
    }
  }
  else {
    while (iVar2 == 0x22) {
      this->_pos = this->_pos + 1;
      Builder::reportAdd(this->_builderPtr);
      position = this->_builderPtr->_pos;
      parseString(this);
      this_00 = this->options->attributeTranslator;
      if ((this_00 != (AttributeTranslator *)0x0) &&
         (puVar5 = this->_builderPtr->_start, local_38 = puVar5 + position,
         (ulong)puVar5[position] - 0x40 < 0x80)) {
        key_00 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                           ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                            &local_38);
        puVar5 = AttributeTranslator::translate(this_00,key_00);
        if (puVar5 != (uint8_t *)0x0) {
          pBVar1 = this->_builderPtr;
          pBVar1->_pos = position;
          Buffer<unsigned_char>::resetTo(pBVar1->_bufferPtr,position);
          pBVar1 = this->_builderPtr;
          local_40 = puVar5;
          v = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUInt
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_40);
          Builder::addUInt(pBVar1,v);
        }
      }
      iVar3 = skipWhiteSpace(this,"Expecting \':\'");
      if (iVar3 != 0x3a) {
        parseObject();
LAB_0010cc6a:
        this_01 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception(this_01,ParseError,"Expecting \',\' or \'}\'");
        __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
      }
      this->_pos = this->_pos + 1;
      parseJson(this);
      iVar3 = 0x116264;
      iVar2 = skipWhiteSpace(this,"Expecting \',\' or \'}\'");
      if (iVar2 == 0x7d) goto LAB_0010cc2f;
      if (iVar2 != 0x2c) goto LAB_0010cc6a;
      this->_pos = this->_pos + 1;
      iVar3 = 0x116241;
      iVar2 = skipWhiteSpace(this,"Expecting \'\"\' or \'}\'");
    }
    parseObject();
LAB_0010cc2f:
    this->_pos = this->_pos + 1;
    if ((this->_nesting != 1) || (uVar4 = 0, this->options->keepTopLevelOpen == false)) {
      Builder::close(this->_builderPtr,iVar3);
      uVar4 = this->_nesting - 1;
    }
    this->_nesting = uVar4;
  }
  return;
}

Assistant:

void Parser::parseObject() {
  _builderPtr->addObject();

  increaseNesting();
  int i = skipWhiteSpace("Expecting item or '}'");
  if (i == '}') {
    // empty object
    consume();  // the closing '}'. return value intentionally not checked

    if (_nesting != 0 || !options->keepTopLevelOpen) {
      // only close if we've not been asked to keep top level open
      decreaseNesting();
      _builderPtr->close();
    }
    return;
  }

  while (true) {
    // always expecting a string attribute name here
    if (VELOCYPACK_UNLIKELY(i != '"')) {
      throw Exception(Exception::ParseError, "Expecting '\"' or '}'");
    }
    // get past the initial '"'
    ++_pos;

    _builderPtr->reportAdd();
    auto const lastPos = _builderPtr->_pos;
    parseString();

    if (options->attributeTranslator != nullptr) {
      // check if a translation for the attribute name exists
      Slice key(_builderPtr->_start + lastPos);

      if (key.isString()) {
        uint8_t const* translated =
            options->attributeTranslator->translate(key.stringView());

        if (translated != nullptr) {
          // found translation... now reset position to old key position
          // and simply overwrite the existing key with the numeric translation
          // id
          _builderPtr->resetTo(lastPos);
          _builderPtr->addUInt(Slice(translated).getUInt());
        }
      }
    }

    i = skipWhiteSpace("Expecting ':'");
    // always expecting the ':' here
    if (VELOCYPACK_UNLIKELY(i != ':')) {
      throw Exception(Exception::ParseError, "Expecting ':'");
    }
    ++_pos;  // skip over the colon

    parseJson();

    i = skipWhiteSpace("Expecting ',' or '}'");
    if (i == '}') {
      // end of object
      ++_pos;  // the closing '}'
      if (_nesting != 1 || !options->keepTopLevelOpen) {
        // only close if we've not been asked to keep top level open
        _builderPtr->close();
      }
      decreaseNesting();
      return;
    }
    if (VELOCYPACK_UNLIKELY(i != ',')) {
      throw Exception(Exception::ParseError, "Expecting ',' or '}'");
    }
    // skip over ','
    ++_pos;  // the ','
    i = skipWhiteSpace("Expecting '\"' or '}'");
  }

  // should never get here
  VELOCYPACK_ASSERT(false);
}